

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

void __thiscall
llama_model_loader::llama_model_loader
          (llama_model_loader *this,string *fname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,bool use_mmap,bool check_tensors,llama_model_kv_override *param_overrides_p,
          llama_model_tensor_buft_override *param_tensor_buft_overrides_p)

{
  uint64_t *puVar1;
  char *pcVar2;
  _Rb_tree_color _Var3;
  unsigned_short uVar4;
  _Alloc_hider _Var5;
  gguf_context_ptr *pgVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  int *piVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  llm_arch arch;
  llama_fver lVar12;
  undefined4 uVar13;
  char *pcVar14;
  size_t sVar15;
  pointer __p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ggml_tensor *pgVar17;
  iterator iVar18;
  long lVar19;
  size_t __n;
  mapped_type *pmVar20;
  undefined8 uVar21;
  ulong uVar22;
  _Base_ptr p_Var23;
  undefined8 uVar24;
  undefined8 uVar25;
  runtime_error *prVar26;
  undefined8 uVar27;
  undefined7 in_register_00000009;
  pointer pbVar28;
  pointer pbVar29;
  llama_ftype lVar30;
  mapped_type mVar31;
  string *psVar32;
  undefined7 in_register_00000081;
  uint uVar33;
  uint16_t n_split;
  uint32_t ftype_val;
  vector<char,_std::allocator<char>_> buf;
  ggml_context *ctx;
  string kv_split_no;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *__range1;
  string split_prefix;
  __hashtable *__h;
  unsigned_short local_264;
  unsigned_short local_262;
  llama_model_loader *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  LLM_KV *local_238;
  gguf_context_ptr *local_230;
  undefined4 local_228;
  allocator_type local_221;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_220;
  string local_218;
  ggml_context *local_1f8;
  string local_1f0;
  string *local_1d0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
  *local_1c8;
  undefined4 local_1bc;
  undefined1 local_1b8 [32];
  _Base_ptr local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  *local_180;
  vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
  *local_178;
  undefined4 local_16c;
  undefined1 local_168 [8];
  pointer pbStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Rb_tree_node_base *local_148;
  size_t local_140;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_40;
  int *local_38;
  
  local_16c = (undefined4)CONCAT71(in_register_00000081,check_tensors);
  local_1bc = (undefined4)CONCAT71(in_register_00000009,use_mmap);
  this->n_kv = 0;
  this->n_tensors = 0;
  this->n_created = 0;
  local_178 = (vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
               *)&this->files;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
               *)&this->weights_map;
  local_198 = &(this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->n_elements = 0;
  this->n_bytes = 0;
  this->use_mmap = false;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_198;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_198;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->kv_overrides;
  (this->kv_overrides)._M_h._M_buckets = &(this->kv_overrides)._M_h._M_single_bucket;
  (this->kv_overrides)._M_h._M_bucket_count = 1;
  (this->kv_overrides)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kv_overrides)._M_h._M_element_count = 0;
  (this->kv_overrides)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kv_overrides)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kv_overrides)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_230 = &this->meta;
  local_180 = (vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
               *)&this->contexts;
  local_188 = &this->arch_name;
  local_190 = &(this->arch_name).field_2;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl = (gguf_context *)0x0;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arch_name)._M_dataplus._M_p = (pointer)local_190;
  (this->arch_name)._M_string_length = 0;
  (this->arch_name).field_2._M_local_buf[0] = '\0';
  local_238 = &this->llm_kv;
  local_220 = splits;
  LLM_KV::LLM_KV(local_238,LLM_ARCH_UNKNOWN,(char *)0x0);
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->size_done = 0;
  this->size_data = 0;
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260 = this;
  pcVar14 = getenv("LLAMA_TRACE");
  local_1d0 = fname;
  if (pcVar14 == (char *)0x0) {
    local_228 = 0;
  }
  else {
    iVar11 = atoi(pcVar14);
    local_228 = CONCAT31((int3)((uint)iVar11 >> 8),0 < iVar11);
  }
  if ((param_overrides_p != (llama_model_kv_override *)0x0) && (param_overrides_p->key[0] != '\0'))
  {
    pcVar14 = param_overrides_p->key;
    paVar16 = &local_258.field_2;
    do {
      local_258._M_dataplus._M_p = (pointer)paVar16;
      sVar15 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,pcVar14,pcVar14 + sVar15)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p == paVar16) {
        local_158._8_8_ = local_258.field_2._8_8_;
        local_168 = (undefined1  [8])&local_158;
      }
      else {
        local_168 = (undefined1  [8])local_258._M_dataplus._M_p;
      }
      local_158._M_allocated_capacity._1_7_ = local_258.field_2._M_allocated_capacity._1_7_;
      local_158._M_local_buf[0] = local_258.field_2._M_local_buf[0];
      pbStack_160 = (pointer)local_258._M_string_length;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_258._M_dataplus._M_p = (pointer)paVar16;
      memcpy(&local_148,(llama_model_kv_override *)(pcVar14 + -4),0x108);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,llama_model_kv_override>>
                (local_40,local_168);
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar16) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      pcVar2 = pcVar14 + 0x108;
      pcVar14 = pcVar14 + 0x108;
    } while (*pcVar2 != '\0');
  }
  psVar32 = local_1d0;
  pgVar6 = local_230;
  local_260->tensor_buft_overrides = param_tensor_buft_overrides_p;
  local_1f8 = (ggml_context *)0x0;
  __p = (pointer)gguf_init_from_file((local_1d0->_M_dataplus)._M_p,1);
  std::__uniq_ptr_impl<gguf_context,_gguf_context_deleter>::reset
            ((__uniq_ptr_impl<gguf_context,_gguf_context_deleter> *)pgVar6,__p);
  if ((pgVar6->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
      super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl == (gguf_context *)0x0) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_((string *)local_168,"%s: failed to load model from %s\n","llama_model_loader",
                      (psVar32->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar26,(string *)local_168);
    __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_((string *)local_168,local_238,LLM_KV_GENERAL_ARCHITECTURE);
  get_key<std::__cxx11::string>(local_260,(string *)local_168,local_188,false);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  arch = llm_arch_from_string(local_188);
  LLM_KV::LLM_KV((LLM_KV *)local_168,arch,(char *)0x0);
  *(undefined1 (*) [8])local_238 = local_168;
  local_238->suffix = (char *)pbStack_160;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)operator_new(8);
  llama_file::llama_file
            ((llama_file *)&paVar16->_M_allocated_capacity,(psVar32->_M_dataplus)._M_p,"rb");
  local_168 = (undefined1  [8])paVar16;
  std::
  vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
  ::emplace_back<llama_file*>(local_178,(llama_file **)local_168);
  std::
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  ::emplace_back<ggml_context*&>(local_180,&local_1f8);
  pgVar17 = (ggml_tensor *)ggml_get_first_tensor(local_1f8);
  local_38 = &local_260->n_tensors;
  puVar1 = &local_260->n_elements;
  for (; pgVar17 != (ggml_tensor *)0x0;
      pgVar17 = (ggml_tensor *)ggml_get_next_tensor(local_1f8,pgVar17)) {
    local_168 = (undefined1  [8])&local_158;
    sVar15 = strlen(pgVar17->name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,pgVar17->name,pgVar17->name + sVar15);
    iVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                     *)local_1c8,(key_type *)local_168);
    if (iVar18._M_node != local_198) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar27 = ggml_get_name(pgVar17);
      format_abi_cxx11_(&local_258,"invalid model: tensor \'%s\' is duplicated",uVar27);
      std::runtime_error::runtime_error(prVar26,(string *)&local_258);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar19 = ggml_nelements(pgVar17);
    *puVar1 = *puVar1 + lVar19;
    lVar19 = ggml_nbytes(pgVar17);
    local_260->n_bytes = local_260->n_bytes + lVar19;
    llama_tensor_weight::llama_tensor_weight
              ((llama_tensor_weight *)&local_258,
               (local_260->files).
               super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
               super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
               super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,0,
               (local_260->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
               .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,pgVar17);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
    ::_M_emplace_unique<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
              (local_1c8,(key_type *)local_168,(llama_tensor_weight *)&local_258);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
    }
  }
  local_262 = 0;
  LLM_KV::operator()[abi_cxx11_((string *)local_168,local_238,LLM_KV_SPLIT_COUNT);
  get_key<unsigned_short>(local_260,(string *)local_168,&local_262,false);
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
  }
  if (1 < local_262) {
    local_264 = 0;
    LLM_KV::operator()[abi_cxx11_(&local_1f0,local_238,LLM_KV_SPLIT_NO);
    get_key<unsigned_short>(local_260,&local_1f0,&local_264,true);
    uVar4 = local_262;
    if (local_264 != 0) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)local_168,
                        "illegal split file idx: %d (file: %s), model must be loaded with the first split"
                        ,(ulong)local_264,(psVar32->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar26,(string *)local_168);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar29 = (local_220->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar28 = (local_220->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar29 == pbVar28) {
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      local_168 = (undefined1  [8])&local_158;
      pbStack_160 = (pointer)0x0;
      local_158._M_allocated_capacity = local_158._M_allocated_capacity & 0xffffffffffffff00;
      __n = llama_path_max();
      local_258._M_dataplus._M_p = local_258._M_dataplus._M_p & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_218,__n,(value_type *)&local_258,
                 &local_221);
      iVar11 = llama_split_prefix(local_218._M_dataplus._M_p,
                                  local_218._M_string_length - (long)local_218._M_dataplus._M_p,
                                  (local_1d0->_M_dataplus)._M_p,0,(uint)uVar4);
      if (iVar11 == 0) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&local_258,"invalid split file name: %s",(local_1d0->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar26,(string *)&local_258);
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar16 = &local_258.field_2;
      local_258._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_258,local_218._M_dataplus._M_p,local_218._M_dataplus._M_p + iVar11
                );
      std::__cxx11::string::operator=((string *)local_168,(string *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar16) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      if (pbStack_160 == (pointer)0x0) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&local_258,"invalid split file: %s",(local_1d0->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar26,(string *)&local_258);
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar4 != 0) {
        uVar33 = 0;
        do {
          iVar11 = llama_split_path(local_218._M_dataplus._M_p,
                                    local_218._M_string_length - (long)local_218._M_dataplus._M_p,
                                    (char *)local_168,uVar33,(uint)uVar4);
          local_258._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,local_218._M_dataplus._M_p,
                     local_218._M_dataplus._M_p + iVar11);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b8,
                     &local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != paVar16) {
            operator_delete(local_258._M_dataplus._M_p,
                            CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                     local_258.field_2._M_local_buf[0]) + 1);
          }
          uVar33 = uVar33 + 1;
        } while (uVar4 != uVar33);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_218._M_dataplus._M_p,
                        local_218.field_2._M_allocated_capacity - (long)local_218._M_dataplus._M_p);
      }
      if (local_168 != (undefined1  [8])&local_158) {
        operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
      }
      pvVar7 = local_220;
      local_158._M_allocated_capacity =
           (size_type)
           (local_220->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_220->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._16_8_;
      local_168 = (undefined1  [8])
                  (local_220->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      pbStack_160 = (local_220->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      (local_220->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
      (local_220->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      pbVar29 = (pvVar7->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar28 = (pvVar7->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (local_262 != (ushort)((uint)((int)pbVar28 - (int)pbVar29) >> 5)) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)local_168,
                        "invalid split count, given: %zu splits, but expected %d",
                        (long)(local_220->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_220->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5,(ulong)local_262);
      std::runtime_error::runtime_error(prVar26,(string *)local_168);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((char)local_228 != '\0') {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading additional %d GGUFs\n",
                         "llama_model_loader",(ulong)local_262);
    }
    local_264 = 1;
    if (1 < local_262) {
      do {
        pcVar14 = (local_220->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[local_264]._M_dataplus._M_p;
        local_218._M_dataplus._M_p = (pointer)gguf_init_from_file(pcVar14,1,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_((string *)local_168,"%s: failed to load GGUF split from %s\n",
                            "llama_model_loader",pcVar14);
          std::runtime_error::runtime_error(prVar26,(string *)local_168);
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar33 = gguf_find_key(local_218._M_dataplus._M_p,
                               CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                        (ggml_type)local_1f0._M_dataplus._M_p));
        if ((int)uVar33 < 0) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_((string *)local_168,"missing key %s in GGUF split %s",
                            CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                     (ggml_type)local_1f0._M_dataplus._M_p),pcVar14);
          std::runtime_error::runtime_error(prVar26,(string *)local_168);
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar10 = gguf_get_val_u16(local_218._M_dataplus._M_p,uVar33 & 0x7fffffff);
        if (uVar10 != local_264) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          format_abi_cxx11_((string *)local_168,"invalid split file idx: %d (file: %s), expected %d"
                            ,(ulong)uVar10,pcVar14,(ulong)local_264);
          std::runtime_error::runtime_error(prVar26,(string *)local_168);
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(8);
        llama_file::llama_file((llama_file *)&paVar16->_M_allocated_capacity,pcVar14,"rb");
        local_168 = (undefined1  [8])paVar16;
        std::
        vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
        ::emplace_back<llama_file*>(local_178,(llama_file **)local_168);
        std::
        vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
        ::emplace_back<ggml_context*&>(local_180,&local_1f8);
        for (pgVar17 = (ggml_tensor *)ggml_get_first_tensor(local_1f8);
            pgVar17 != (ggml_tensor *)0x0;
            pgVar17 = (ggml_tensor *)ggml_get_next_tensor(local_1f8,pgVar17)) {
          local_168 = (undefined1  [8])&local_158;
          sVar15 = strlen(pgVar17->name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,pgVar17->name,pgVar17->name + sVar15);
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                           *)local_1c8,(key_type *)local_168);
          if (iVar18._M_node != local_198) {
            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
            uVar27 = ggml_get_name(pgVar17);
            format_abi_cxx11_(&local_258,"invalid model: tensor \'%s\' is duplicated",uVar27);
            std::runtime_error::runtime_error(prVar26,(string *)&local_258);
            __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar19 = ggml_nelements(pgVar17);
          *puVar1 = *puVar1 + lVar19;
          lVar19 = ggml_nbytes(pgVar17);
          local_260->n_bytes = local_260->n_bytes + lVar19;
          llama_tensor_weight::llama_tensor_weight
                    ((llama_tensor_weight *)&local_258,
                     (local_260->files).
                     super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                     super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                     super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                     super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,local_264,
                     (gguf_context *)local_218._M_dataplus._M_p,pgVar17);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
          ::_M_emplace_unique<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
                    (local_1c8,(key_type *)local_168,(llama_tensor_weight *)&local_258);
          if (local_168 != (undefined1  [8])&local_158) {
            operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
          }
        }
        std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
                  ((unique_ptr<gguf_context,_gguf_context_deleter> *)&local_218);
        local_264 = local_264 + 1;
      } while (local_264 < local_262);
    }
    LLM_KV::operator()[abi_cxx11_((string *)local_168,local_238,LLM_KV_SPLIT_TENSORS_COUNT);
    piVar8 = local_38;
    get_key<int>(local_260,(string *)local_168,local_38,true);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,(ulong)(local_158._M_allocated_capacity + 1));
    }
    uVar33 = (uint)(local_260->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (local_260->n_tensors != uVar33) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)local_168,"corrupted model: %d tensors expected but %d found",
                        (ulong)(uint)*piVar8,(ulong)uVar33);
      std::runtime_error::runtime_error(prVar26,(string *)local_168);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: additional %d GGUFs metadata loaded.\n",
                       "llama_model_loader",(ulong)(local_262 - 1));
    psVar32 = local_1d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(ggml_type)local_1f0._M_dataplus._M_p) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                               (ggml_type)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar11 = gguf_get_n_kv((local_230->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                         ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                         super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  local_260->n_kv = iVar11;
  local_260->n_tensors =
       (int)(local_260->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  lVar12 = gguf_get_version((local_260->meta)._M_t.
                            super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                            super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  local_260->fver = lVar12;
  if (lVar12 - GGUF_FILE_VERSION_V1 < 3) {
    pcVar14 = (&PTR_anon_var_dwarf_17b930_00286040)[lVar12 - GGUF_FILE_VERSION_V1];
  }
  else {
    pcVar14 = "unknown";
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n"
                     ,"llama_model_loader",(ulong)(uint)local_260->n_kv,
                     (ulong)(uint)local_260->n_tensors,(psVar32->_M_dataplus)._M_p,pcVar14);
  local_158._8_8_ = &pbStack_160;
  pbStack_160 = (pointer)((ulong)pbStack_160 & 0xffffffff00000000);
  local_158._M_allocated_capacity = 0;
  local_140 = 0;
  p_Var23 = (local_260->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar30 = LLAMA_FTYPE_GUESSED;
  local_148 = (_Rb_tree_node_base *)local_158._8_8_;
  if (p_Var23 != local_198) {
    local_238 = (LLM_KV *)0x0;
    mVar31 = 0;
    do {
      pgVar17 = (ggml_tensor *)p_Var23[2]._M_left;
      local_1f0._M_dataplus._M_p._0_4_ = pgVar17->type;
      pmVar20 = std::
                map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                              *)local_168,(key_type *)&local_1f0);
      *pmVar20 = *pmVar20 + 1;
      pmVar20 = std::
                map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                              *)local_168,(key_type *)&local_1f0);
      if (mVar31 < *pmVar20) {
        pmVar20 = std::
                  map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                  ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                                *)local_168,(key_type *)&local_1f0);
        mVar31 = *pmVar20;
        local_238 = (LLM_KV *)(ulong)(ggml_type)local_1f0._M_dataplus._M_p;
      }
      if ((char)local_228 != '\0') {
        local_220 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(local_220._4_4_,mVar31);
        _Var3 = p_Var23[2]._M_color;
        uVar27 = ggml_get_name(pgVar17);
        uVar21 = ggml_type_name((ggml_type)local_1f0._M_dataplus._M_p);
        llama_format_tensor_shape_abi_cxx11_(&local_258,pgVar17);
        _Var5._M_p = local_258._M_dataplus._M_p;
        uVar22 = ggml_nbytes(pgVar17);
        llama_log_internal(GGML_LOG_LEVEL_INFO,
                           "%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n",
                           SUB84((double)((float)uVar22 * 0.0009765625 * 0.0009765625),0),
                           "llama_model_loader",(ulong)(ushort)(short)_Var3,uVar27,uVar21,_Var5._M_p
                          );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,
                          CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                   local_258.field_2._M_local_buf[0]) + 1);
        }
        mVar31 = (mapped_type)local_220;
      }
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != local_198);
    if (((uint)local_238 < 0x24) && ((0xc60ff7dcfU >> ((ulong)local_238 & 0x3f) & 1) != 0)) {
      lVar30 = *(llama_ftype *)(&DAT_0023a018 + ((ulong)local_238 & 0xffffffff) * 4);
    }
    else {
      ggml_type_name();
      lVar30 = LLAMA_FTYPE_GUESSED;
      llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: unknown type %s\n","llama_model_loader");
    }
  }
  local_260->ftype = lVar30;
  local_258._M_dataplus._M_p = local_258._M_dataplus._M_p & 0xffffffff00000000;
  bVar9 = get_key<unsigned_int>(local_260,LLM_KV_GENERAL_FILE_TYPE,(uint *)&local_258,false);
  if (bVar9) {
    local_260->ftype = (llama_ftype)local_258._M_dataplus._M_p;
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n"
                     ,"llama_model_loader");
  if (0 < local_260->n_kv) {
    uVar22 = 0;
    do {
      pgVar6 = local_230;
      uVar27 = gguf_get_key((local_230->_M_t).
                            super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                            super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar22);
      iVar11 = gguf_get_kv_type((pgVar6->_M_t).
                                super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar22);
      if (iVar11 == 9) {
        uVar21 = gguf_type_name(9);
        uVar13 = gguf_get_arr_type((local_230->_M_t).
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar22)
        ;
        uVar24 = gguf_type_name(uVar13);
        uVar25 = gguf_get_arr_n((local_230->_M_t).
                                super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar22);
        format_abi_cxx11_(&local_258,"%s[%s,%zu]",uVar21,uVar24,uVar25);
      }
      else {
        pcVar14 = (char *)gguf_type_name(iVar11);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,pcVar14,(allocator<char> *)&local_1f0);
      }
      gguf_kv_to_str_abi_cxx11_
                (&local_1f0,
                 (local_230->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                 super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                 super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,(int)uVar22);
      if (0x28 < local_1f0._M_string_length) {
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_1f0);
        format_abi_cxx11_(&local_218,"%s...",local_1b8._0_8_);
        std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\n","");
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"\\n","");
      replace_all(&local_1f0,&local_218,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - kv %3d: %42s %-16s = %s\n","llama_model_loader",
                         uVar22 & 0xffffffff,uVar27,local_258._M_dataplus._M_p,
                         CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                  (ggml_type)local_1f0._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(ggml_type)local_1f0._M_dataplus._M_p) !=
          &local_1f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                 (ggml_type)local_1f0._M_dataplus._M_p),
                        local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)local_260->n_kv);
  }
  uVar27 = local_158._8_8_;
  if ((_Rb_tree_node_base *)local_158._8_8_ != (_Rb_tree_node_base *)&pbStack_160) {
    do {
      if (*(int *)&((_Rb_tree_node_base *)(uVar27 + 0x20))->field_0x4 != 0) {
        uVar21 = ggml_type_name(((_Rb_tree_node_base *)(uVar27 + 0x20))->_M_color);
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - type %4s: %4d tensors\n","llama_model_loader",
                           uVar21,(ulong)*(uint *)&((_Rb_tree_node_base *)(uVar27 + 0x20))->
                                                   field_0x4);
      }
      uVar27 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar27);
    } while ((_Rb_tree_node_base *)uVar27 != (_Rb_tree_node_base *)&pbStack_160);
  }
  std::
  _Rb_tree<ggml_type,_std::pair<const_ggml_type,_unsigned_int>,_std::_Select1st<std::pair<const_ggml_type,_unsigned_int>_>,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<ggml_type,_std::pair<const_ggml_type,_unsigned_int>,_std::_Select1st<std::pair<const_ggml_type,_unsigned_int>_>,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
               *)local_168);
  local_260->use_mmap = SUB41(local_1bc,0);
  local_260->check_tensors = SUB41(local_16c,0);
  return;
}

Assistant:

llama_model_loader::llama_model_loader(
        const std::string & fname,
        std::vector<std::string> & splits,
        bool use_mmap,
        bool check_tensors,
        const llama_model_kv_override * param_overrides_p,
        const llama_model_tensor_buft_override * param_tensor_buft_overrides_p) {
    int trace = 0;
    if (getenv("LLAMA_TRACE")) {
        trace = atoi(getenv("LLAMA_TRACE"));
    }

    if (param_overrides_p != nullptr) {
        for (const struct llama_model_kv_override * p = param_overrides_p; p->key[0] != 0; p++) {
            kv_overrides.insert({std::string(p->key), *p});
        }
    }

    tensor_buft_overrides = param_tensor_buft_overrides_p;

    // Load the main GGUF
    struct ggml_context * ctx = NULL;
    struct gguf_init_params params = {
        /*.no_alloc = */ true,
        /*.ctx      = */ &ctx,
    };

    meta.reset(gguf_init_from_file(fname.c_str(), params));
    if (!meta) {
        throw std::runtime_error(format("%s: failed to load model from %s\n", __func__, fname.c_str()));
    }

    get_key(llm_kv(LLM_KV_GENERAL_ARCHITECTURE), arch_name, false);
    llm_kv = LLM_KV(llm_arch_from_string(arch_name));

    files.emplace_back(new llama_file(fname.c_str(), "rb"));
    contexts.emplace_back(ctx);

    // Save tensors data offset of the main file.
    // For subsidiary files, `meta` tensor data offset must not be used,
    // so we build a unified tensors index for weights.
    for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
        std::string tensor_name = std::string(cur->name);
        // make sure there is no duplicated tensor names
        if (weights_map.find(tensor_name) != weights_map.end()) {
            throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
        }
        n_elements += ggml_nelements(cur);
        n_bytes    += ggml_nbytes(cur);
        weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), 0, meta.get(), cur));
    }
    uint16_t n_split = 0;
    get_key(llm_kv(LLM_KV_SPLIT_COUNT), n_split, false);

    // Load additional GGML contexts
    if (n_split > 1) {
        // make sure the main file is loaded first
        uint16_t idx = 0;
        const std::string kv_split_no = llm_kv(LLM_KV_SPLIT_NO);
        get_key(kv_split_no, idx);
        if (idx != 0) {
            throw std::runtime_error(format("illegal split file idx: %d (file: %s), model must be loaded with the first split", idx, fname.c_str()));
        }

        // generate list of splits if needed
        if (splits.empty()) {
            splits = llama_get_list_splits(fname, idx, n_split);
        }

        // in case user give a custom list of splits, check if it matches the expected number
        if (n_split != (uint16_t)splits.size()) {
            throw std::runtime_error(format("invalid split count, given: %zu splits, but expected %d", splits.size(), n_split));
        }

        if (trace > 0) {
            LLAMA_LOG_INFO("%s: loading additional %d GGUFs\n", __func__, n_split);
        }

        // load other splits
        for (idx = 1; idx < n_split; idx++) {
            const char * fname_split = splits[idx].c_str();

            struct gguf_init_params split_params = {
                /*.no_alloc = */ true,
                /*.ctx      = */ &ctx,
            };
            gguf_context_ptr ctx_gguf { gguf_init_from_file(fname_split, split_params) };
            if (!ctx_gguf) {
                throw std::runtime_error(format("%s: failed to load GGUF split from %s\n", __func__, fname_split));
            }

            // check idx
            {
                const int kid = gguf_find_key(ctx_gguf.get(), kv_split_no.c_str());
                if (kid < 0) {
                    throw std::runtime_error(format("missing key %s in GGUF split %s", kv_split_no.c_str(), fname_split));
                }
                int idx_gguf = gguf_get_val_u16(ctx_gguf.get(), kid);
                if (idx_gguf != idx) {
                    throw std::runtime_error(format("invalid split file idx: %d (file: %s), expected %d", idx_gguf, fname_split, idx));
                }
            }

            files.emplace_back(new llama_file(fname_split, "rb"));
            contexts.emplace_back(ctx);

            // Save tensors data offset info of the shard.
            for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
                std::string tensor_name = std::string(cur->name);
                // make sure there is no duplicated tensor names
                if (weights_map.find(tensor_name) != weights_map.end()) {
                    throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
                }
                n_elements += ggml_nelements(cur);
                n_bytes    += ggml_nbytes(cur);
                weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), idx, ctx_gguf.get(), cur));
            }
        }

        get_key(llm_kv(LLM_KV_SPLIT_TENSORS_COUNT), n_tensors);

        // sanity check
        {
            const int n_tensors_loaded = (int) weights_map.size();
            if (n_tensors != n_tensors_loaded) {
                throw std::runtime_error(format("corrupted model: %d tensors expected but %d found", n_tensors, n_tensors_loaded));
            }
        }

        LLAMA_LOG_INFO("%s: additional %d GGUFs metadata loaded.\n",  __func__, n_split - 1);
    }

    n_kv      = gguf_get_n_kv(meta.get());
    n_tensors = weights_map.size();

    fver = (enum llama_fver) gguf_get_version(meta.get());

    LLAMA_LOG_INFO("%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n",
            __func__, n_kv, n_tensors, fname.c_str(), llama_file_version_name(fver));

    // determine file type based on the number of tensors for each quantization and print meta data
    // TODO: make optional
    {
        std::map<enum ggml_type, uint32_t> n_type;

        uint32_t n_type_max = 0;
        enum ggml_type type_max = GGML_TYPE_F32;

        for (const auto & it : weights_map) {
            const llama_tensor_weight & w = it.second;
            const ggml_tensor * tensor = w.tensor;

            enum ggml_type type = tensor->type;

            n_type[type]++;

            if (n_type_max < n_type[type]) {
                n_type_max = n_type[type];
                type_max   = type;
            }

            if (trace > 0) {
                const uint16_t sid = w.idx;
                LLAMA_LOG_INFO("%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n", __func__,
                        sid, ggml_get_name(tensor), ggml_type_name(type), llama_format_tensor_shape(tensor).c_str(),
                        ggml_nbytes(tensor)/1024.0f/1024.0f);
            }
        }

        switch (type_max) {
            case GGML_TYPE_F32:     ftype = LLAMA_FTYPE_ALL_F32;        break;
            case GGML_TYPE_F16:     ftype = LLAMA_FTYPE_MOSTLY_F16;     break;
            case GGML_TYPE_BF16:    ftype = LLAMA_FTYPE_MOSTLY_BF16;    break;
            case GGML_TYPE_Q4_0:    ftype = LLAMA_FTYPE_MOSTLY_Q4_0;    break;
            case GGML_TYPE_Q4_1:    ftype = LLAMA_FTYPE_MOSTLY_Q4_1;    break;
            case GGML_TYPE_Q5_0:    ftype = LLAMA_FTYPE_MOSTLY_Q5_0;    break;
            case GGML_TYPE_Q5_1:    ftype = LLAMA_FTYPE_MOSTLY_Q5_1;    break;
            case GGML_TYPE_Q8_0:    ftype = LLAMA_FTYPE_MOSTLY_Q8_0;    break;
            case GGML_TYPE_Q2_K:    ftype = LLAMA_FTYPE_MOSTLY_Q2_K;    break;
            case GGML_TYPE_Q3_K:    ftype = LLAMA_FTYPE_MOSTLY_Q3_K_M;  break;
            case GGML_TYPE_Q4_K:    ftype = LLAMA_FTYPE_MOSTLY_Q4_K_M;  break;
            case GGML_TYPE_Q5_K:    ftype = LLAMA_FTYPE_MOSTLY_Q5_K_M;  break;
            case GGML_TYPE_Q6_K:    ftype = LLAMA_FTYPE_MOSTLY_Q6_K;    break;
            case GGML_TYPE_TQ1_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ1_0;   break;
            case GGML_TYPE_TQ2_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ2_0;   break;
            case GGML_TYPE_IQ2_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ2_XXS; break;
            case GGML_TYPE_IQ2_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ2_XS;  break;
            case GGML_TYPE_IQ2_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ2_S;   break;
            case GGML_TYPE_IQ3_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ3_XXS; break;
            case GGML_TYPE_IQ1_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_S;   break;
            case GGML_TYPE_IQ1_M:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_M;   break;
            case GGML_TYPE_IQ4_NL:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_NL;  break;
            case GGML_TYPE_IQ4_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_XS;  break;
            case GGML_TYPE_IQ3_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ3_S;   break;
            default:
                {
                    LLAMA_LOG_WARN("%s: unknown type %s\n", __func__, ggml_type_name(type_max));
                    ftype = LLAMA_FTYPE_ALL_F32;
                } break;
        }

        // this is a way to mark that we have "guessed" the file type
        ftype = (llama_ftype) (ftype | LLAMA_FTYPE_GUESSED);

        {
            uint32_t ftype_val = 0;
            if (get_key(LLM_KV_GENERAL_FILE_TYPE, ftype_val, false)) {
                ftype = (llama_ftype) ftype_val;
            }
        }

        LLAMA_LOG_INFO("%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n", __func__);

        for (int i = 0; i < n_kv; i++) {
            const char * name           = gguf_get_key(meta.get(), i);
            const enum gguf_type type   = gguf_get_kv_type(meta.get(), i);
            const std::string type_name =
                type == GGUF_TYPE_ARRAY
                ? format("%s[%s,%zu]", gguf_type_name(type), gguf_type_name(gguf_get_arr_type(meta.get(), i)), gguf_get_arr_n(meta.get(), i))
                : gguf_type_name(type);

            std::string value          = gguf_kv_to_str(meta.get(), i);
            const size_t MAX_VALUE_LEN = 40;
            if (value.size() > MAX_VALUE_LEN) {
                value = format("%s...", value.substr(0, MAX_VALUE_LEN - 3).c_str());
            }
            replace_all(value, "\n", "\\n");

            LLAMA_LOG_INFO("%s: - kv %3d: %42s %-16s = %s\n", __func__, i, name, type_name.c_str(), value.c_str());
        }

        // print type counts
        for (auto & kv : n_type) {
            if (kv.second == 0) {
                continue;
            }

            LLAMA_LOG_INFO("%s: - type %4s: %4d tensors\n", __func__, ggml_type_name(kv.first), kv.second);
        }
    }

    if (!llama_mmap::SUPPORTED) {
        LLAMA_LOG_WARN("%s: mmap is not supported on this platform\n", __func__);
        use_mmap = false;
    }

    this->use_mmap = use_mmap;
    this->check_tensors = check_tensors;
}